

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

string * google::protobuf::compiler::python::anon_unknown_0::ModuleName
                   (string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  char *__s;
  allocator<char> local_61;
  string local_60;
  string basename;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,".protodevel",&local_61);
  bVar1 = HasSuffixString(filename,&local_60);
  __s = ".proto";
  if (bVar1) {
    __s = ".protodevel";
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  StripSuffixString(&basename,filename,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  google::protobuf::StripString((string *)&basename,"-",'_');
  google::protobuf::StripString((string *)&basename,"/",'.');
  std::operator+(__return_storage_ptr__,&basename,"_pb2");
  std::__cxx11::string::~string((string *)&basename);
  return __return_storage_ptr__;
}

Assistant:

string ModuleName(const string& filename) {
  string basename = StripProto(filename);
  StripString(&basename, "-", '_');
  StripString(&basename, "/", '.');
  return basename + "_pb2";
}